

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cast.h
# Opt level: O1

ptr<Value> __thiscall Cast::evaluate(Cast *this,Environment *env)

{
  size_type sVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  _func_int **pp_Var8;
  element_type *peVar9;
  undefined4 *puVar10;
  element_type *peVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  undefined **ppuVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  ptr<Value> pVar13;
  ptr<Value> value;
  undefined1 local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  Expression local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  _func_int **local_28;
  
  (*(code *)**(undefined8 **)(env->symbols)._M_h._M_bucket_count)(&local_58);
  switch((int)(env->symbols)._M_h._M_element_count) {
  case 1:
    (**(code **)(*local_58 + 0x10))(&local_78);
    local_48._vptr_Expression = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<String,std::allocator<String>,std::__cxx11::string&>
              (&local_40,(String **)&local_48,(allocator<String> *)&local_79,&local_78);
    _Var2._M_pi = local_40._M_pi;
    (this->super_UnaryOperator).super_Expression._vptr_Expression = local_48._vptr_Expression;
    (this->super_UnaryOperator).expression.
    super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_UnaryOperator).expression.
    super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var2._M_pi;
    local_48._vptr_Expression = (_func_int **)0x0;
    ppuVar12 = (undefined **)extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      ppuVar12 = (undefined **)extraout_RDX_00;
    }
    goto LAB_00118965;
  case 2:
    local_28 = (_func_int **)(**(code **)(*local_58 + 0x20))();
    peVar9 = (element_type *)operator_new(0x20);
    peVar9[1]._vptr_Expression = (_func_int **)0x100000001;
    peVar9->_vptr_Expression = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012f488;
    peVar11 = peVar9 + 2;
    ppuVar12 = &PTR__Member_0012f4d8;
    peVar9[2]._vptr_Expression = (_func_int **)&PTR__Member_0012f4d8;
    peVar9[3]._vptr_Expression = local_28;
    break;
  case 3:
    pp_Var8 = (_func_int **)(**(code **)(*local_58 + 0x18))();
    peVar9 = (element_type *)operator_new(0x20);
    peVar9[1]._vptr_Expression = (_func_int **)0x100000001;
    peVar9->_vptr_Expression = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012f548;
    peVar11 = peVar9 + 2;
    ppuVar12 = &PTR__Member_0012f598;
    peVar9[2]._vptr_Expression = (_func_int **)&PTR__Member_0012f598;
    peVar9[3]._vptr_Expression = pp_Var8;
    break;
  case 4:
    uVar7 = (**(code **)(*local_58 + 0x28))();
    peVar9 = (element_type *)operator_new(0x20);
    peVar9[1]._vptr_Expression = (_func_int **)0x100000001;
    peVar9->_vptr_Expression = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012f608;
    peVar11 = peVar9 + 2;
    ppuVar12 = &PTR__Member_0012f658;
    peVar9[2]._vptr_Expression = (_func_int **)&PTR__Member_0012f658;
    *(undefined1 *)&peVar9[3]._vptr_Expression = uVar7;
    break;
  case 5:
    (**(code **)(*local_58 + 0x30))(&local_78);
    ppuVar12 = (undefined **)extraout_RDX_01;
    goto LAB_00118949;
  case 6:
    (**(code **)(*local_58 + 0x38))(&local_78);
    ppuVar12 = (undefined **)extraout_RDX_02;
LAB_00118949:
    sVar1 = local_78._M_string_length;
    (this->super_UnaryOperator).super_Expression._vptr_Expression =
         (_func_int **)local_78._M_dataplus._M_p;
    (this->super_UnaryOperator).expression.
    super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_78._M_string_length = 0;
    (this->super_UnaryOperator).expression.
    super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)sVar1;
    goto LAB_00118965;
  default:
    puVar10 = (undefined4 *)__cxa_allocate_exception(0x10);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Could not cast value","");
    ExceptionObjects::bad_cast((ExceptionObjects *)&local_38,&local_78);
    uVar3 = (undefined4)local_38;
    uVar4 = local_38._4_4_;
    uVar5 = (undefined4)uStack_30;
    uVar6 = uStack_30._4_4_;
    local_38 = 0;
    uStack_30 = 0;
    *puVar10 = uVar3;
    puVar10[1] = uVar4;
    puVar10[2] = uVar5;
    puVar10[3] = uVar6;
    __cxa_throw(puVar10,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
  }
  (this->super_UnaryOperator).super_Expression._vptr_Expression = (_func_int **)peVar11;
  (this->super_UnaryOperator).expression.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar9;
LAB_00118965:
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    ppuVar12 = (undefined **)extraout_RDX_03;
  }
  pVar13.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar12;
  pVar13.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar13.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> evaluate(Environment *env) override {
        ptr<Value> value = expression -> evaluate(env);

        if(type == Type::Object)
            return value -> asObject();
        else if(type == Type::Array)
            return value -> asArray();
        else if(type == Type::String)
            return make<String>(value -> asString());
        else if(type == Type::Double)
            return make<Double>(value -> asDouble());
        else if(type == Type::Integer)
            return make<Integer>(value -> asInteger());
        else if(type == Type::Boolean)
            return make<Boolean>(value -> asBoolean());

        throw ThrowPacket(ExceptionObjects::bad_cast("Could not cast value"));
    }